

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusproxy.h
# Opt level: O3

QIBusProxy * __thiscall QIBusProxy::GetProperty(QIBusProxy *this,QString method)

{
  char cVar1;
  QDBusMessage *this_00;
  QString *in_RDX;
  long in_FS_OFFSET;
  bool bVar2;
  QDBusMessage msg;
  QString local_b8;
  undefined1 local_a0 [8];
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QArrayData *local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QDBusAbstractInterface::isValid();
  if (cVar1 != '\0') {
    QDBusAbstractInterface::service();
    if (local_78._16_8_ == 0) {
      bVar2 = true;
    }
    else {
      QDBusAbstractInterface::path();
      bVar2 = local_98.d.data._16_8_ == 0;
      if ((QArrayData *)local_98.d.data.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_98.d.data.shared = *(int *)local_98.d.data.shared + -1;
        UNLOCK();
        if (*(int *)local_98.d.data.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_98.d.data.shared,2,0x10);
        }
      }
    }
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
      }
    }
    if (!bVar2) {
      local_a0 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
      QDBusAbstractInterface::service();
      QDBusAbstractInterface::path();
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = L"org.freedesktop.DBus.Properties";
      local_b8.d.size = 0x1f;
      QDBusMessage::createMethodCall
                ((QString *)local_a0,(QString *)&local_78,(QString *)&local_98,&local_b8);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_98.d.data.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_98.d.data.shared = *(int *)local_98.d.data.shared + -1;
        UNLOCK();
        if (*(int *)local_98.d.data.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_98.d.data.shared,2,0x10);
        }
      }
      if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_78.shared = *(int *)local_78.shared + -1;
        UNLOCK();
        if (*(int *)local_78.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
        }
      }
      QDBusAbstractInterface::interface();
      QVariant::QVariant((QVariant *)&local_78,&local_b8);
      this_00 = (QDBusMessage *)
                QDBusMessage::operator<<((QDBusMessage *)local_a0,(QVariant *)&local_78);
      QVariant::QVariant(&local_98,in_RDX);
      QDBusMessage::operator<<(this_00,&local_98);
      QVariant::~QVariant(&local_98);
      QVariant::~QVariant((QVariant *)&local_78);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDBusAbstractInterface::connection();
      QDBusAbstractInterface::timeout();
      QDBusConnection::asyncCall((QDBusMessage *)this,(int)&local_78);
      QDBusConnection::~QDBusConnection((QDBusConnection *)local_78.data);
      QDBusMessage::~QDBusMessage((QDBusMessage *)local_a0);
      goto LAB_00119b05;
    }
  }
  QDBusAbstractInterface::lastError();
  QDBusPendingCall::fromError((QDBusError *)this);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if ((QArrayData *)local_78._8_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78._8_8_ = *(int *)local_78._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_78._8_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_78._8_8_,2,0x10);
    }
  }
LAB_00119b05:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QDBusPendingCall GetProperty(const QString method)
    {
        if (!this->isValid() || this->service().isEmpty() || this->path().isEmpty())
             return QDBusPendingCall::fromError(this->lastError());

        QDBusMessage msg = QDBusMessage::createMethodCall(this->service(),
                                                          this->path(),
                                                          dbusInterfaceProperties(),
                                                          QStringLiteral("Get"));
        msg << this->interface() << method;
        return this->connection().asyncCall(msg, this->timeout());
    }